

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall SceneRender::renderBuffers(SceneRender *this,Uniforms *_uniforms)

{
  pointer *pppFVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  iterator __position;
  Camera *_camera;
  Shader *pSVar26;
  uint uVar27;
  uint uVar28;
  Fbo *pFVar29;
  pointer ppFVar30;
  long *plVar31;
  mapped_type *ppSVar32;
  float *pfVar33;
  _Base_ptr p_Var34;
  pointer ppFVar35;
  size_type *psVar36;
  ulong uVar37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  string bufferName;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  string local_168;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  long local_118;
  undefined8 uStack_110;
  size_type local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  size_type local_98;
  undefined8 uStack_90;
  unsigned_long local_88;
  Tracker *local_80;
  key_type local_78;
  vector<vera::Fbo*,std::allocator<vera::Fbo*>> *local_58;
  _Base_ptr local_50;
  Model *local_48;
  ShaderMap *local_40;
  mat4 *local_38;
  
  local_58 = (vector<vera::Fbo*,std::allocator<vera::Fbo*>> *)&this->buffersFbo;
  if (this->m_buffers_total !=
      (long)(this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl
            .super__Vector_impl_data._M_start >> 3) {
    ppFVar30 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppFVar35 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar35 != ppFVar30) {
      uVar37 = 0;
      do {
        if (ppFVar30[uVar37] != (Fbo *)0x0) {
          (*ppFVar30[uVar37]->_vptr_Fbo[1])();
        }
        uVar37 = uVar37 + 1;
        ppFVar30 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppFVar35 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      } while (uVar37 < (ulong)((long)ppFVar35 - (long)ppFVar30 >> 3));
    }
    if (ppFVar35 != ppFVar30) {
      (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppFVar30;
    }
    if (this->m_buffers_total != 0) {
      uVar37 = 0;
      do {
        pFVar29 = (Fbo *)operator_new(0x38);
        vera::Fbo::Fbo(pFVar29);
        __position._M_current =
             (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_1e8 = (undefined1  [8])pFVar29;
        if (__position._M_current ==
            (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<vera::Fbo*,std::allocator<vera::Fbo*>>::_M_realloc_insert<vera::Fbo*>
                    (local_58,__position,(Fbo **)local_1e8);
        }
        else {
          *__position._M_current = pFVar29;
          pppFVar1 = &(this->buffersFbo).
                      super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        pFVar29 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar37];
        uVar27 = vera::getWindowWidth();
        uVar28 = vera::getWindowHeight();
        (*pFVar29->_vptr_Fbo[2])(pFVar29,(ulong)uVar27,(ulong)uVar28,4,0,0,1);
        uVar37 = uVar37 + 1;
      } while (uVar37 < this->m_buffers_total);
    }
  }
  local_88 = 0;
  ppFVar30 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar30) {
    local_38 = &(this->m_origin).m_transformMatrix;
    local_48 = &this->m_floor;
    local_40 = &(this->m_floor).gBuffersShaders;
    local_80 = &_uniforms->tracker;
    local_50 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pFVar29 = ppFVar30[local_88];
      if (pFVar29->m_allocated == false) {
        uVar27 = vera::getWindowWidth();
        uVar28 = vera::getWindowHeight();
        (*pFVar29->_vptr_Fbo[2])(pFVar29,(ulong)uVar27,(ulong)uVar28,4,0,0,1);
      }
      paVar38 = &local_1a8.field_2;
      (**(code **)(**(long **)(*(long *)local_58 + local_88 * 8) + 0x18))();
      vera::toString<unsigned_long>((string *)local_1e8,&local_88);
      plVar31 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x2f1d1d);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      psVar36 = (size_type *)(plVar31 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar31 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar36) {
        local_78.field_2._M_allocated_capacity = *psVar36;
        local_78.field_2._8_8_ = plVar31[3];
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar36;
        local_78._M_dataplus._M_p = (pointer)*plVar31;
      }
      local_78._M_string_length = plVar31[1];
      *plVar31 = (long)psVar36;
      plVar31[1] = 0;
      *(undefined1 *)(plVar31 + 2) = 0;
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,(long)local_1d8 + 1);
      }
      if (this->m_depth_test == true) {
        glEnable(0xb71);
      }
      _camera = (_uniforms->super_Scene).activeCamera;
      if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
        vera::setCamera(_camera);
        vera::applyMatrix(local_38);
      }
      if (-1 < this->m_floor_subd_target) {
        ppSVar32 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                   ::operator[](local_40,&local_78);
        pSVar26 = *ppSVar32;
        if (pSVar26 != (Shader *)0x0) {
          if ((_uniforms->tracker).m_running == true) {
            std::operator+(&local_1a8,"render:",&local_78);
            plVar31 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_1e8 = (undefined1  [8])local_1d8;
            pFVar29 = (Fbo *)(plVar31 + 2);
            if ((Fbo *)*plVar31 == pFVar29) {
              local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
              _fStack_1d0 = plVar31[3];
            }
            else {
              local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
              local_1e8 = (undefined1  [8])*plVar31;
            }
            uStack_1e0 = plVar31[1];
            *plVar31 = (long)pFVar29;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            Tracker::begin(local_80,(string *)local_1e8);
            if (local_1e8 != (undefined1  [8])local_1d8) {
              operator_delete((void *)local_1e8,(long)local_1d8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != paVar38) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          vera::Shader::use(pSVar26);
          (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar26,0);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"u_modelViewProjectionMatrix","");
          vera::getProjectionViewWorldMatrix();
          fVar39 = SUB84(local_1a8._M_dataplus._M_p,0);
          local_a8 = (float)((ulong)local_1a8._M_dataplus._M_p >> 0x20);
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1a8._M_dataplus._M_p;
          uStack_b0 = 0;
          fVar41 = (float)local_1a8._M_string_length;
          local_e8 = (float)(local_1a8._M_string_length >> 0x20);
          fVar42 = (float)local_1a8.field_2._M_allocated_capacity;
          local_f8 = (float)((ulong)local_1a8.field_2._0_8_ >> 0x20);
          local_108 = local_1a8.field_2._M_allocated_capacity;
          uStack_100 = 0;
          fVar43 = (float)local_1a8.field_2._8_8_;
          local_c8 = (float)((ulong)local_1a8.field_2._8_8_ >> 0x20);
          fVar44 = (float)local_188;
          local_d8 = (float)((ulong)local_188 >> 0x20);
          fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
          fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
          fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
          local_98 = local_1a8._M_string_length;
          uStack_90 = 0;
          local_118 = local_1a8.field_2._8_8_;
          uStack_110 = 0;
          local_128 = local_188;
          uStack_120 = 0;
          fVar40 = (float)local_180;
          local_138 = (float)((ulong)local_180 >> 0x20);
          local_148 = local_180;
          uStack_140 = 0;
          fVar45 = (float)local_178;
          fVar46 = (float)((ulong)local_178 >> 0x20);
          fVar5 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
          fVar47 = (float)local_170;
          fVar48 = (float)((ulong)local_170 >> 0x20);
          fVar6 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
          fVar7 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
          fVar8 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
          fVar9 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
          fVar10 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
          fVar11 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
          fVar12 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
          fVar13 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
          fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
          fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
          fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
          fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
          local_1e8._4_4_ = fVar46 * fVar5 + local_d8 * fVar4 + local_f8 * fVar3 + local_a8 * fVar2;
          local_1e8._0_4_ = fVar45 * fVar5 + fVar44 * fVar4 + fVar42 * fVar3 + fVar39 * fVar2;
          uStack_1e0 = CONCAT44(fVar5 * fVar48 +
                                fVar4 * local_138 + fVar3 * local_c8 + fVar2 * local_e8,
                                fVar47 * fVar5 + fVar40 * fVar4 + fVar43 * fVar3 + fVar41 * fVar2);
          local_1d8._4_4_ = fVar46 * fVar9 + local_d8 * fVar8 + local_f8 * fVar7 + local_a8 * fVar6;
          local_1d8._0_4_ = fVar45 * fVar9 + fVar44 * fVar8 + fVar42 * fVar7 + fVar39 * fVar6;
          fStack_1cc = fVar9 * fVar48 + fVar8 * local_138 + fVar7 * local_c8 + fVar6 * local_e8;
          fStack_1d0 = fVar47 * fVar9 + fVar40 * fVar8 + fVar43 * fVar7 + fVar41 * fVar6;
          local_1c8 = fVar45 * fVar13 + fVar44 * fVar12 + fVar42 * fVar11 + fVar39 * fVar10;
          fStack_1c4 = fVar46 * fVar13 + local_d8 * fVar12 + local_f8 * fVar11 + local_a8 * fVar10;
          fStack_1c0 = fVar47 * fVar13 + fVar40 * fVar12 + fVar43 * fVar11 + fVar41 * fVar10;
          fStack_1bc = fVar13 * fVar48 + fVar12 * local_138 + fVar11 * local_c8 + fVar10 * local_e8;
          local_1b8 = fVar45 * fVar17 + fVar44 * fVar16 + fVar42 * fVar15 + fVar39 * fVar14;
          fStack_1b4 = fVar46 * fVar17 + local_d8 * fVar16 + local_f8 * fVar15 + local_a8 * fVar14;
          fStack_1b0 = fVar47 * fVar17 + fVar40 * fVar16 + fVar43 * fVar15 + fVar41 * fVar14;
          fStack_1ac = fVar48 * fVar17 + local_138 * fVar16 + local_c8 * fVar15 + local_e8 * fVar14;
          fStack_134 = local_138;
          fStack_130 = local_138;
          fStack_12c = local_138;
          fStack_f4 = local_f8;
          fStack_f0 = local_f8;
          fStack_ec = local_f8;
          fStack_e4 = local_e8;
          fStack_e0 = local_e8;
          fStack_dc = local_e8;
          fStack_d4 = local_d8;
          fStack_d0 = local_d8;
          fStack_cc = local_d8;
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_a4 = local_a8;
          fStack_a0 = local_a8;
          fStack_9c = local_a8;
          vera::Shader::setUniform(pSVar26,&local_168,(mat4 *)local_1e8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          local_1e8 = (undefined1  [8])local_1d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"u_model","");
          vera::Shader::setUniform
                    (pSVar26,(string *)local_1e8,
                     (this->m_origin).m_position.field_0.x +
                     (this->m_floor).super_Node.m_position.field_0.x,
                     (this->m_origin).m_position.field_1.y +
                     (this->m_floor).super_Node.m_position.field_1.y,
                     (this->m_origin).m_position.field_2.z +
                     (this->m_floor).super_Node.m_position.field_2.z);
          if (local_1e8 != (undefined1  [8])local_1d8) {
            operator_delete((void *)local_1e8,(long)local_1d8 + 1);
          }
          local_1a8._M_dataplus._M_p = (pointer)paVar38;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u_modelMatrix","");
          local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
          local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
          uStack_b0 = 0;
          local_98._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
          local_98._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
          local_108._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
          local_108._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
          uStack_100 = 0;
          local_118._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
          local_118._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
          local_128._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
          local_128._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
          fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
          fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
          fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
          uStack_90 = 0;
          uStack_110 = 0;
          uStack_120 = 0;
          local_148._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
          local_148._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
          uStack_140 = 0;
          uVar18 = (this->m_origin).m_transformMatrix.value[3].field_0;
          uVar22 = (this->m_origin).m_transformMatrix.value[3].field_1;
          fVar5 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
          uVar19 = (this->m_origin).m_transformMatrix.value[3].field_2;
          uVar23 = (this->m_origin).m_transformMatrix.value[3].field_3;
          fVar6 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
          fVar7 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
          fVar8 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
          fVar9 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
          fVar10 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
          fVar11 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
          fVar12 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
          fVar13 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
          fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
          fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
          fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
          fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
          local_1e8._4_4_ =
               (float)uVar22 * fVar5 +
               (float)local_128._4_4_ * fVar4 +
               (float)local_108._4_4_ * fVar3 + (float)local_b8._4_4_ * fVar2;
          local_1e8._0_4_ =
               (float)uVar18 * fVar5 +
               (float)(undefined4)local_128 * fVar4 +
               (float)(undefined4)local_108 * fVar3 + (float)local_b8._0_4_ * fVar2;
          uStack_1e0 = CONCAT44(fVar5 * (float)uVar23 +
                                fVar4 * (float)local_148._4_4_ +
                                fVar3 * (float)local_118._4_4_ + fVar2 * (float)local_98._4_4_,
                                (float)uVar19 * fVar5 +
                                (float)(undefined4)local_148 * fVar4 +
                                (float)(undefined4)local_118 * fVar3 +
                                (float)(undefined4)local_98 * fVar2);
          local_1d8._4_4_ =
               (float)uVar22 * fVar9 +
               (float)local_128._4_4_ * fVar8 +
               (float)local_108._4_4_ * fVar7 + (float)local_b8._4_4_ * fVar6;
          local_1d8._0_4_ =
               (float)uVar18 * fVar9 +
               (float)(undefined4)local_128 * fVar8 +
               (float)(undefined4)local_108 * fVar7 + (float)local_b8._0_4_ * fVar6;
          fStack_1cc = fVar9 * (float)uVar23 +
                       fVar8 * (float)local_148._4_4_ +
                       fVar7 * (float)local_118._4_4_ + fVar6 * (float)local_98._4_4_;
          fStack_1d0 = (float)uVar19 * fVar9 +
                       (float)(undefined4)local_148 * fVar8 +
                       (float)(undefined4)local_118 * fVar7 + (float)(undefined4)local_98 * fVar6;
          local_1c8 = (float)uVar18 * fVar13 +
                      (float)(undefined4)local_128 * fVar12 +
                      (float)(undefined4)local_108 * fVar11 + (float)local_b8._0_4_ * fVar10;
          fStack_1c4 = (float)uVar22 * fVar13 +
                       (float)local_128._4_4_ * fVar12 +
                       (float)local_108._4_4_ * fVar11 + (float)local_b8._4_4_ * fVar10;
          fStack_1c0 = (float)uVar19 * fVar13 +
                       (float)(undefined4)local_148 * fVar12 +
                       (float)(undefined4)local_118 * fVar11 + (float)(undefined4)local_98 * fVar10;
          fStack_1bc = fVar13 * (float)uVar23 +
                       fVar12 * (float)local_148._4_4_ +
                       fVar11 * (float)local_118._4_4_ + fVar10 * (float)local_98._4_4_;
          local_1b8 = (float)uVar18 * fVar17 +
                      (float)(undefined4)local_128 * fVar16 +
                      (float)(undefined4)local_108 * fVar15 + (float)local_b8._0_4_ * fVar14;
          fStack_1b4 = (float)uVar22 * fVar17 +
                       (float)local_128._4_4_ * fVar16 +
                       (float)local_108._4_4_ * fVar15 + (float)local_b8._4_4_ * fVar14;
          fStack_1b0 = (float)uVar19 * fVar17 +
                       (float)(undefined4)local_148 * fVar16 +
                       (float)(undefined4)local_118 * fVar15 + (float)(undefined4)local_98 * fVar14;
          fStack_1ac = (float)uVar23 * fVar17 +
                       (float)local_148._4_4_ * fVar16 +
                       (float)local_118._4_4_ * fVar15 + (float)local_98._4_4_ * fVar14;
          local_138 = (float)local_148._4_4_;
          fStack_134 = (float)local_148._4_4_;
          fStack_130 = (float)local_148._4_4_;
          fStack_12c = (float)local_148._4_4_;
          local_f8 = (float)local_108._4_4_;
          fStack_f4 = (float)local_108._4_4_;
          fStack_f0 = (float)local_108._4_4_;
          fStack_ec = (float)local_108._4_4_;
          local_e8 = (float)local_98._4_4_;
          fStack_e4 = (float)local_98._4_4_;
          fStack_e0 = (float)local_98._4_4_;
          fStack_dc = (float)local_98._4_4_;
          local_d8 = (float)local_128._4_4_;
          fStack_d4 = (float)local_128._4_4_;
          fStack_d0 = (float)local_128._4_4_;
          fStack_cc = (float)local_128._4_4_;
          local_c8 = (float)local_118._4_4_;
          fStack_c4 = (float)local_118._4_4_;
          fStack_c0 = (float)local_118._4_4_;
          fStack_bc = (float)local_118._4_4_;
          local_a8 = (float)local_b8._4_4_;
          fStack_a4 = (float)local_b8._4_4_;
          fStack_a0 = (float)local_b8._4_4_;
          fStack_9c = (float)local_b8._4_4_;
          vera::Shader::setUniform(pSVar26,&local_1a8,(mat4 *)local_1e8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar38) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          vera::Model::render(local_48,pSVar26);
          if ((_uniforms->tracker).m_running == true) {
            std::operator+(&local_1a8,"render:",&local_78);
            plVar31 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_1e8 = (undefined1  [8])local_1d8;
            pFVar29 = (Fbo *)(plVar31 + 2);
            if ((Fbo *)*plVar31 == pFVar29) {
              local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
              _fStack_1d0 = plVar31[3];
            }
            else {
              local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
              local_1e8 = (undefined1  [8])*plVar31;
            }
            uStack_1e0 = plVar31[1];
            *plVar31 = (long)pFVar29;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            Tracker::end(local_80,(string *)local_1e8);
            if (local_1e8 != (undefined1  [8])local_1d8) {
              operator_delete((void *)local_1e8,(long)local_1d8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != paVar38) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      vera::cullingMode(this->m_culling);
      p_Var34 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      if (p_Var34 != local_50) {
        do {
          ppSVar32 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                   *)(*(long *)(p_Var34 + 2) + 600),&local_78);
          pSVar26 = *ppSVar32;
          if (pSVar26 != (Shader *)0x0) {
            if ((_uniforms->tracker).m_running == true) {
              std::operator+(&local_168,"render:",&local_78);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_168);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              psVar36 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar36) {
                local_1a8.field_2._M_allocated_capacity = *psVar36;
                local_1a8.field_2._8_8_ = plVar31[3];
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar36;
                local_1a8._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_1a8._M_string_length = plVar31[1];
              *plVar31 = (long)psVar36;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              plVar31 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_1a8,
                                           *(ulong *)(*(long *)(p_Var34 + 2) + 0x2b0));
              local_1e8 = (undefined1  [8])local_1d8;
              pFVar29 = (Fbo *)(plVar31 + 2);
              if ((Fbo *)*plVar31 == pFVar29) {
                local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
                _fStack_1d0 = plVar31[3];
              }
              else {
                local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
                local_1e8 = (undefined1  [8])*plVar31;
              }
              uStack_1e0 = plVar31[1];
              *plVar31 = (long)pFVar29;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              Tracker::begin(local_80,(string *)local_1e8);
              if (local_1e8 != (undefined1  [8])local_1d8) {
                operator_delete((void *)local_1e8,(long)local_1d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
            }
            vera::Shader::use(pSVar26);
            (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar26,0);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,"u_modelViewProjectionMatrix","");
            vera::getProjectionViewWorldMatrix();
            pfVar33 = (float *)(**(code **)(**(long **)(p_Var34 + 2) + 0x100))();
            fVar39 = SUB84(local_1a8._M_dataplus._M_p,0);
            local_a8 = (float)((ulong)local_1a8._M_dataplus._M_p >> 0x20);
            local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1a8._M_dataplus._M_p;
            uStack_b0 = 0;
            fVar41 = (float)local_1a8._M_string_length;
            local_e8 = (float)(local_1a8._M_string_length >> 0x20);
            fVar42 = (float)local_1a8.field_2._M_allocated_capacity;
            local_f8 = (float)((ulong)local_1a8.field_2._0_8_ >> 0x20);
            local_108 = local_1a8.field_2._M_allocated_capacity;
            uStack_100 = 0;
            fVar43 = (float)local_1a8.field_2._8_8_;
            local_c8 = (float)((ulong)local_1a8.field_2._8_8_ >> 0x20);
            fVar44 = (float)local_188;
            local_d8 = (float)((ulong)local_188 >> 0x20);
            fVar2 = *pfVar33;
            fVar3 = pfVar33[1];
            fVar4 = pfVar33[2];
            local_98 = local_1a8._M_string_length;
            uStack_90 = 0;
            local_118 = local_1a8.field_2._8_8_;
            uStack_110 = 0;
            local_128 = local_188;
            uStack_120 = 0;
            fVar40 = (float)local_180;
            local_138 = (float)((ulong)local_180 >> 0x20);
            local_148 = local_180;
            uStack_140 = 0;
            fVar45 = (float)local_178;
            fVar46 = (float)((ulong)local_178 >> 0x20);
            fVar5 = pfVar33[3];
            fVar47 = (float)local_170;
            fVar48 = (float)((ulong)local_170 >> 0x20);
            fVar6 = pfVar33[4];
            fVar7 = pfVar33[5];
            fVar8 = pfVar33[6];
            fVar9 = pfVar33[7];
            fVar10 = pfVar33[8];
            fVar11 = pfVar33[9];
            fVar12 = pfVar33[10];
            fVar13 = pfVar33[0xb];
            fVar14 = pfVar33[0xc];
            fVar15 = pfVar33[0xd];
            fVar16 = pfVar33[0xe];
            fVar17 = pfVar33[0xf];
            local_1e8._4_4_ =
                 fVar46 * fVar5 + local_d8 * fVar4 + local_f8 * fVar3 + local_a8 * fVar2;
            local_1e8._0_4_ = fVar45 * fVar5 + fVar44 * fVar4 + fVar42 * fVar3 + fVar39 * fVar2;
            uStack_1e0 = CONCAT44(fVar5 * fVar48 +
                                  fVar4 * local_138 + fVar3 * local_c8 + fVar2 * local_e8,
                                  fVar47 * fVar5 + fVar40 * fVar4 + fVar43 * fVar3 + fVar41 * fVar2)
            ;
            local_1d8._4_4_ =
                 fVar46 * fVar9 + local_d8 * fVar8 + local_f8 * fVar7 + local_a8 * fVar6;
            local_1d8._0_4_ = fVar45 * fVar9 + fVar44 * fVar8 + fVar42 * fVar7 + fVar39 * fVar6;
            fStack_1cc = fVar9 * fVar48 + fVar8 * local_138 + fVar7 * local_c8 + fVar6 * local_e8;
            fStack_1d0 = fVar47 * fVar9 + fVar40 * fVar8 + fVar43 * fVar7 + fVar41 * fVar6;
            local_1c8 = fVar45 * fVar13 + fVar44 * fVar12 + fVar42 * fVar11 + fVar39 * fVar10;
            fStack_1c4 = fVar46 * fVar13 + local_d8 * fVar12 + local_f8 * fVar11 + local_a8 * fVar10
            ;
            fStack_1c0 = fVar47 * fVar13 + fVar40 * fVar12 + fVar43 * fVar11 + fVar41 * fVar10;
            fStack_1bc = fVar13 * fVar48 +
                         fVar12 * local_138 + fVar11 * local_c8 + fVar10 * local_e8;
            local_1b8 = fVar45 * fVar17 + fVar44 * fVar16 + fVar42 * fVar15 + fVar39 * fVar14;
            fStack_1b4 = fVar46 * fVar17 + local_d8 * fVar16 + local_f8 * fVar15 + local_a8 * fVar14
            ;
            fStack_1b0 = fVar47 * fVar17 + fVar40 * fVar16 + fVar43 * fVar15 + fVar41 * fVar14;
            fStack_1ac = fVar48 * fVar17 +
                         local_138 * fVar16 + local_c8 * fVar15 + local_e8 * fVar14;
            fStack_134 = local_138;
            fStack_130 = local_138;
            fStack_12c = local_138;
            fStack_f4 = local_f8;
            fStack_f0 = local_f8;
            fStack_ec = local_f8;
            fStack_e4 = local_e8;
            fStack_e0 = local_e8;
            fStack_dc = local_e8;
            fStack_d4 = local_d8;
            fStack_d0 = local_d8;
            fStack_cc = local_d8;
            fStack_c4 = local_c8;
            fStack_c0 = local_c8;
            fStack_bc = local_c8;
            fStack_a4 = local_a8;
            fStack_a0 = local_a8;
            fStack_9c = local_a8;
            vera::Shader::setUniform(pSVar26,&local_168,(mat4 *)local_1e8,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            local_1e8 = (undefined1  [8])local_1d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"u_model","");
            pfVar33 = (float *)(**(code **)(**(long **)(p_Var34 + 2) + 0x98))();
            vera::Shader::setUniform
                      (pSVar26,(string *)local_1e8,(this->m_origin).m_position.field_0.x + *pfVar33,
                       (this->m_origin).m_position.field_1.y + pfVar33[1],
                       (this->m_origin).m_position.field_2.z + pfVar33[2]);
            if (local_1e8 != (undefined1  [8])local_1d8) {
              operator_delete((void *)local_1e8,(long)local_1d8 + 1);
            }
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u_modelMatrix","")
            ;
            pfVar33 = (float *)(**(code **)(**(long **)(p_Var34 + 2) + 0x100))();
            local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
            local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
            uStack_b0 = 0;
            local_98._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
            local_98._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
            local_108._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
            local_108._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
            uStack_100 = 0;
            local_118._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
            local_118._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
            local_128._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
            local_128._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
            fVar2 = *pfVar33;
            fVar3 = pfVar33[1];
            fVar4 = pfVar33[2];
            uStack_90 = 0;
            uStack_110 = 0;
            uStack_120 = 0;
            local_148._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
            local_148._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
            uStack_140 = 0;
            uVar20 = (this->m_origin).m_transformMatrix.value[3].field_0;
            uVar24 = (this->m_origin).m_transformMatrix.value[3].field_1;
            fVar5 = pfVar33[3];
            uVar21 = (this->m_origin).m_transformMatrix.value[3].field_2;
            uVar25 = (this->m_origin).m_transformMatrix.value[3].field_3;
            fVar6 = pfVar33[4];
            fVar7 = pfVar33[5];
            fVar8 = pfVar33[6];
            fVar9 = pfVar33[7];
            fVar10 = pfVar33[8];
            fVar11 = pfVar33[9];
            fVar12 = pfVar33[10];
            fVar13 = pfVar33[0xb];
            fVar14 = pfVar33[0xc];
            fVar15 = pfVar33[0xd];
            fVar16 = pfVar33[0xe];
            fVar17 = pfVar33[0xf];
            local_1e8._4_4_ =
                 (float)uVar24 * fVar5 +
                 (float)local_128._4_4_ * fVar4 +
                 (float)local_108._4_4_ * fVar3 + (float)local_b8._4_4_ * fVar2;
            local_1e8._0_4_ =
                 (float)uVar20 * fVar5 +
                 (float)(undefined4)local_128 * fVar4 +
                 (float)(undefined4)local_108 * fVar3 + (float)local_b8._0_4_ * fVar2;
            uStack_1e0 = CONCAT44(fVar5 * (float)uVar25 +
                                  fVar4 * (float)local_148._4_4_ +
                                  fVar3 * (float)local_118._4_4_ + fVar2 * (float)local_98._4_4_,
                                  (float)uVar21 * fVar5 +
                                  (float)(undefined4)local_148 * fVar4 +
                                  (float)(undefined4)local_118 * fVar3 +
                                  (float)(undefined4)local_98 * fVar2);
            local_1d8._4_4_ =
                 (float)uVar24 * fVar9 +
                 (float)local_128._4_4_ * fVar8 +
                 (float)local_108._4_4_ * fVar7 + (float)local_b8._4_4_ * fVar6;
            local_1d8._0_4_ =
                 (float)uVar20 * fVar9 +
                 (float)(undefined4)local_128 * fVar8 +
                 (float)(undefined4)local_108 * fVar7 + (float)local_b8._0_4_ * fVar6;
            fStack_1cc = fVar9 * (float)uVar25 +
                         fVar8 * (float)local_148._4_4_ +
                         fVar7 * (float)local_118._4_4_ + fVar6 * (float)local_98._4_4_;
            fStack_1d0 = (float)uVar21 * fVar9 +
                         (float)(undefined4)local_148 * fVar8 +
                         (float)(undefined4)local_118 * fVar7 + (float)(undefined4)local_98 * fVar6;
            local_1c8 = (float)uVar20 * fVar13 +
                        (float)(undefined4)local_128 * fVar12 +
                        (float)(undefined4)local_108 * fVar11 + (float)local_b8._0_4_ * fVar10;
            fStack_1c4 = (float)uVar24 * fVar13 +
                         (float)local_128._4_4_ * fVar12 +
                         (float)local_108._4_4_ * fVar11 + (float)local_b8._4_4_ * fVar10;
            fStack_1c0 = (float)uVar21 * fVar13 +
                         (float)(undefined4)local_148 * fVar12 +
                         (float)(undefined4)local_118 * fVar11 +
                         (float)(undefined4)local_98 * fVar10;
            fStack_1bc = fVar13 * (float)uVar25 +
                         fVar12 * (float)local_148._4_4_ +
                         fVar11 * (float)local_118._4_4_ + fVar10 * (float)local_98._4_4_;
            local_1b8 = (float)uVar20 * fVar17 +
                        (float)(undefined4)local_128 * fVar16 +
                        (float)(undefined4)local_108 * fVar15 + (float)local_b8._0_4_ * fVar14;
            fStack_1b4 = (float)uVar24 * fVar17 +
                         (float)local_128._4_4_ * fVar16 +
                         (float)local_108._4_4_ * fVar15 + (float)local_b8._4_4_ * fVar14;
            fStack_1b0 = (float)uVar21 * fVar17 +
                         (float)(undefined4)local_148 * fVar16 +
                         (float)(undefined4)local_118 * fVar15 +
                         (float)(undefined4)local_98 * fVar14;
            fStack_1ac = (float)uVar25 * fVar17 +
                         (float)local_148._4_4_ * fVar16 +
                         (float)local_118._4_4_ * fVar15 + (float)local_98._4_4_ * fVar14;
            local_138 = (float)local_148._4_4_;
            fStack_134 = (float)local_148._4_4_;
            fStack_130 = (float)local_148._4_4_;
            fStack_12c = (float)local_148._4_4_;
            local_f8 = (float)local_108._4_4_;
            fStack_f4 = (float)local_108._4_4_;
            fStack_f0 = (float)local_108._4_4_;
            fStack_ec = (float)local_108._4_4_;
            local_e8 = (float)local_98._4_4_;
            fStack_e4 = (float)local_98._4_4_;
            fStack_e0 = (float)local_98._4_4_;
            fStack_dc = (float)local_98._4_4_;
            local_d8 = (float)local_128._4_4_;
            fStack_d4 = (float)local_128._4_4_;
            fStack_d0 = (float)local_128._4_4_;
            fStack_cc = (float)local_128._4_4_;
            local_c8 = (float)local_118._4_4_;
            fStack_c4 = (float)local_118._4_4_;
            fStack_c0 = (float)local_118._4_4_;
            fStack_bc = (float)local_118._4_4_;
            local_a8 = (float)local_b8._4_4_;
            fStack_a4 = (float)local_b8._4_4_;
            fStack_a0 = (float)local_b8._4_4_;
            fStack_9c = (float)local_b8._4_4_;
            vera::Shader::setUniform(pSVar26,&local_1a8,(mat4 *)local_1e8,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            vera::Model::render(*(Model **)(p_Var34 + 2),pSVar26);
            if ((_uniforms->tracker).m_running == true) {
              std::operator+(&local_168,"render:",&local_78);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_168);
              psVar36 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar36) {
                local_1a8.field_2._M_allocated_capacity = *psVar36;
                local_1a8.field_2._8_8_ = plVar31[3];
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar36;
                local_1a8._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_1a8._M_string_length = plVar31[1];
              *plVar31 = (long)psVar36;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              plVar31 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_1a8,
                                           *(ulong *)(*(long *)(p_Var34 + 2) + 0x2b0));
              local_1e8 = (undefined1  [8])local_1d8;
              pFVar29 = (Fbo *)(plVar31 + 2);
              if ((Fbo *)*plVar31 == pFVar29) {
                local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
                _fStack_1d0 = plVar31[3];
              }
              else {
                local_1d8 = (undefined1  [8])pFVar29->_vptr_Fbo;
                local_1e8 = (undefined1  [8])*plVar31;
              }
              uStack_1e0 = plVar31[1];
              *plVar31 = (long)pFVar29;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              Tracker::end(local_80,(string *)local_1e8);
              if (local_1e8 != (undefined1  [8])local_1d8) {
                operator_delete((void *)local_1e8,(long)local_1d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
            }
          }
          p_Var34 = (_Base_ptr)std::_Rb_tree_increment(p_Var34);
        } while (p_Var34 != local_50);
      }
      if (this->m_depth_test != false) {
        glDisable(0xb71);
      }
      if (this->m_culling != CULL_NONE) {
        glDisable(0xb44);
      }
      (**(code **)(**(long **)(*(long *)local_58 + local_88 * 8) + 0x20))();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      local_88 = local_88 + 1;
      ppFVar30 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (local_88 <
             (ulong)((long)(this->buffersFbo).
                           super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppFVar30 >> 3));
  }
  return;
}

Assistant:

void SceneRender::renderBuffers(Uniforms& _uniforms) {
    if ( m_buffers_total != buffersFbo.size() ) {
        for (size_t i = 0; i < buffersFbo.size(); i++)
            delete buffersFbo[i];
        buffersFbo.clear();
        
        for (size_t i = 0; i < m_buffers_total; i++) {
            buffersFbo.push_back( new vera::Fbo() );

            // glm::vec2 size = glm::vec2(vera::getWindowWidth(), vera::getWindowHeight());
            // buffersFbo[i].fixed = getBufferSize(_fragmentShader, "u_sceneBuffer" + vera::toString(i), size);
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
        }
    }

    vera::Shader* bufferShader = nullptr;
    for (size_t i = 0; i < buffersFbo.size(); i++) {
        if (!buffersFbo[i]->isAllocated())
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
            // continue;;

        buffersFbo[i]->bind();
        std::string bufferName = "u_sceneBuffer" + vera::toString(i);

        // Begining of DEPTH for 3D 
        if (m_depth_test)
            glEnable(GL_DEPTH_TEST);

        if (_uniforms.activeCamera->bChange || m_origin.bChange) {
            vera::setCamera( _uniforms.activeCamera );
            vera::applyMatrix( m_origin.getTransformMatrix() );
        }

        if (m_floor_subd_target >= 0) {
            bufferShader = m_floor.getBufferShader(bufferName);
            if (bufferShader != nullptr) {
                    TRACK_BEGIN("render:"+bufferName+":floor")
                    bufferShader->use();
                    _uniforms.feedTo( bufferShader, false );
                    bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * m_floor.getTransformMatrix() );
                    bufferShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                    bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                    m_floor.render(bufferShader);
                    TRACK_END("render:"+bufferName+":floor")
                }
        }

        vera::cullingMode(m_culling);

        for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
            bufferShader = it->second->getBufferShader(bufferName);

            if (bufferShader != nullptr) {
                TRACK_BEGIN("render:" + bufferName + ":" + it->second->getName())

                // bind the shader
                bufferShader->use();

                // Update Uniforms and textures variables to the shader
                _uniforms.feedTo( bufferShader, false );

                // Pass special uniforms
                bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
                bufferShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
                bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
                it->second->render(bufferShader);

                TRACK_END("render:" + bufferName + ":" + it->second->getName())
            }
        }

        if (m_depth_test)
            glDisable(GL_DEPTH_TEST);

        if (m_culling != 0)
            glDisable(GL_CULL_FACE);

        buffersFbo[i]->unbind();
    }
}